

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O1

CalculateGrowingBlockSizeResult
qCalculateGrowingBlockSize(qsizetype elementCount,qsizetype elementSize,qsizetype headerSize)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t allocSize;
  CalculateGrowingBlockSizeResult CVar9;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = elementSize;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = elementCount;
  uVar4 = SUB168(auVar2 * auVar3,0);
  uVar6 = 0xffffffffffffffff;
  uVar8 = uVar6;
  if (SUB168(auVar2 * auVar3,8) == 0) {
    uVar7 = uVar4 + headerSize;
    if (!CARRY8(uVar4,headerSize)) {
      uVar8 = 0xffffffffffffffff;
      if (-1 < (long)uVar7) {
        uVar8 = uVar7;
      }
    }
  }
  uVar4 = uVar6;
  if (-1 < (long)uVar8) {
    lVar1 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    allocSize = 1;
    if (uVar8 != 0) {
      allocSize = 2L << ((byte)lVar1 & 0x3f);
    }
    if ((long)allocSize < 0) {
      allocSize = (allocSize - uVar8 >> 1) + uVar8;
    }
    sVar5 = QtPrivate::expectedAllocSize(allocSize,0x10);
    if (sVar5 == 0) {
      sVar5 = allocSize;
    }
    uVar4 = (long)(sVar5 - headerSize) / elementSize;
    uVar6 = uVar4 * elementSize + headerSize;
  }
  CVar9.elementCount = uVar4;
  CVar9.size = uVar6;
  return CVar9;
}

Assistant:

CalculateGrowingBlockSizeResult
qCalculateGrowingBlockSize(qsizetype elementCount, qsizetype elementSize, qsizetype headerSize) noexcept
{
    CalculateGrowingBlockSizeResult result = {
        qsizetype(-1), qsizetype(-1)
    };

    qsizetype bytes = qCalculateBlockSize(elementCount, elementSize, headerSize);
    if (bytes < 0)
        return result;

    size_t morebytes = static_cast<size_t>(qNextPowerOfTwo(quint64(bytes)));
    if (Q_UNLIKELY(qsizetype(morebytes) < 0)) {
        // grow by half the difference between bytes and morebytes
        // this slows the growth and avoids trying to allocate exactly
        // 2G of memory (on 32bit), something that many OSes can't deliver
        bytes += (morebytes - bytes) / 2;
    } else {
        bytes = qsizetype(morebytes);
    }
    size_t fittedBytes = QtPrivate::expectedAllocSize(bytes, alignof(std::max_align_t));
    if (fittedBytes != 0)
        bytes = fittedBytes;

    result.elementCount = (bytes - headerSize) / elementSize;
    result.size = result.elementCount * elementSize + headerSize;
    return result;
}